

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

void kratos::stmt_set_left(AssignStmt *stmt,Var *target,Var *new_var)

{
  VarType VVar1;
  InternalException *this;
  Var **var;
  string local_40;
  
  var = &stmt->left_;
  VVar1 = stmt->left_->type_;
  if ((VVar1 < Parameter) && ((0x19U >> (VVar1 & 0x1f) & 1) != 0)) {
    if (stmt->left_ == target) {
      std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_40,
                 (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                 &new_var->super_enable_shared_from_this<kratos::Var>);
      *var = (Var *)local_40._M_dataplus._M_p;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_string_length);
        local_40._M_dataplus._M_p = (pointer)*var;
      }
      (*(((Var *)local_40._M_dataplus._M_p)->super_IRNode)._vptr_IRNode[0x14])
                (local_40._M_dataplus._M_p,new_var);
      return;
    }
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Target not found","");
    InternalException::InternalException(this,&local_40);
    __cxa_throw(this,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  }
  change_var_parent(var,target,new_var);
  return;
}

Assistant:

void stmt_set_left(AssignStmt *stmt, Var *target, Var *new_var) {
    auto &left = stmt->left();
    if (left->type() == VarType::Base || left->type() == VarType::PortIO ||
        left->type() == VarType::ConstValue) {
        if (left == target) {
            stmt->set_left(new_var->shared_from_this());
            left->move_linked_to(new_var);
        } else {
            throw InternalException("Target not found");
        }
    } else {
        change_var_parent(left, target, new_var);
    }
}